

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O0

bool __thiscall
ritobin::io::impl_text_read::TextReader::read_hash_string(TextReader *this,FNV1a *value)

{
  bool bVar1;
  string local_68;
  undefined1 local_48 [8];
  string str;
  char *backup;
  FNV1a *value_local;
  TextReader *this_local;
  
  str.field_2._8_8_ = this->cur_;
  bVar1 = read_hash(this,value);
  if (bVar1) {
    this_local._7_1_ = 1;
  }
  else {
    this->cur_ = (char *)str.field_2._8_8_;
    std::__cxx11::string::string((string *)local_48);
    bVar1 = read_string(this,(string *)local_48);
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      FNV1a::operator=(value,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      this_local._7_1_ = 1;
    }
    std::__cxx11::string::~string((string *)local_48);
    if (!bVar1) {
      this_local._7_1_ = 0;
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool read_hash_string(FNV1a& value) noexcept {
            auto const backup = cur_;
            if (read_hash(value)) {
                return true;
            }
            cur_ = backup;
            if (std::string str; read_string(str)) {
                value = { str };
                return true;
            }
            return false;
        }